

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O2

string * cmTarget::GetInterfaceFileSetsPropertyName(string *__return_storage_ptr__,string *type)

{
  bool bVar1;
  allocator<char> *__a;
  char *__s;
  allocator<char> local_14;
  allocator<char> local_13;
  allocator<char> local_12;
  allocator<char> local_11;
  
  bVar1 = std::operator==(type,"HEADERS");
  if (bVar1) {
    __s = "INTERFACE_HEADER_SETS";
    __a = &local_11;
  }
  else {
    bVar1 = std::operator==(type,"CXX_MODULES");
    if (bVar1) {
      __s = "INTERFACE_CXX_MODULE_SETS";
      __a = &local_12;
    }
    else {
      bVar1 = std::operator==(type,"CXX_MODULE_HEADER_UNITS");
      if (bVar1) {
        __s = "INTERFACE_CXX_MODULE_HEADER_UNIT_SETS";
        __a = &local_13;
      }
      else {
        __s = "";
        __a = &local_14;
      }
    }
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,__a);
  return __return_storage_ptr__;
}

Assistant:

std::string cmTarget::GetInterfaceFileSetsPropertyName(const std::string& type)
{
  if (type == "HEADERS") {
    return "INTERFACE_HEADER_SETS";
  }
  if (type == "CXX_MODULES") {
    return "INTERFACE_CXX_MODULE_SETS";
  }
  if (type == "CXX_MODULE_HEADER_UNITS") {
    return "INTERFACE_CXX_MODULE_HEADER_UNIT_SETS";
  }
  return "";
}